

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Future.cpp
# Opt level: O0

void __thiscall
Future<void>::Private::ThreadPool::ThreadPool
          (ThreadPool *this,usize minThreads,usize maxThreads,usize queueSize)

{
  usize queueSize_local;
  usize maxThreads_local;
  usize minThreads_local;
  ThreadPool *this_local;
  
  this->_minThreads = minThreads;
  this->_maxThreads = maxThreads;
  LockFreeQueue<Future<void>::Private::ThreadPool::Job>::LockFreeQueue(&this->_queue,queueSize);
  FastSignal::FastSignal(&this->_dequeuedSignal);
  FastSignal::FastSignal(&this->_enqueuedSignal);
  this->_pushedJobs = 0;
  this->_processedJobs = 0;
  this->_threadCount = 0;
  Mutex::Mutex(&this->_mutex);
  PoolList<Future<void>::Private::ThreadPool::ThreadContext>::PoolList(&this->_threads);
  if (this->_maxThreads < 3) {
    this->_maxThreads = 3;
  }
  return;
}

Assistant:

ThreadPool(usize minThreads = 0, usize maxThreads = System::getProcessorCount(), usize queueSize = 0x100)
        : _minThreads(minThreads), _maxThreads(maxThreads), _queue(queueSize), _pushedJobs(0), _processedJobs(0), _threadCount(0)
    {
      if (_maxThreads < 3)
        _maxThreads = 3;
    }